

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# di_errors.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
(anonymous_namespace)::errors<char[38],char[9],char[4],char[7],char[94]>
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,char (*args) [38],char (*args_1) [9],
          char (*args_2) [4],char (*args_3) [7],char (*args_4) [94])

{
  long lVar1;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  allocator_type local_206;
  allocator local_205;
  allocator local_204;
  allocator local_203;
  allocator local_202;
  allocator local_201;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_200;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_180;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  std::__cxx11::string::string
            ((string *)&local_e0,"scoped<.*>::is_not_convertible_to<.*>",&local_201);
  std::operator+(&local_100,".*",&local_e0);
  std::operator+(&local_c0,&local_100,".*");
  std::__cxx11::string::string((string *)&local_140,"instance",&local_202);
  std::operator+(&local_120,".*",&local_140);
  std::operator+(&local_a0,&local_120,".*");
  std::__cxx11::string::string((string *)&local_180,"int",&local_203);
  std::operator+(&local_160,".*",&local_180);
  std::operator+(&local_80,&local_160,".*");
  std::__cxx11::string::string((string *)&local_1c0,"int.*&",&local_204);
  std::operator+(&local_1a0,".*",&local_1c0);
  std::operator+(&local_60,&local_1a0,".*");
  std::__cxx11::string::string
            ((string *)&local_200,
             "instance is not convertible to the requested type, verify binding: \'di::bind<T>.to\\(value\\)\'?"
             ,&local_205);
  std::operator+(&local_1e0,".*",&local_200);
  std::operator+(&local_40,&local_1e0,".*");
  __l._M_len = 5;
  __l._M_array = &local_c0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(__return_storage_ptr__,__l,&local_206);
  lVar1 = 0x80;
  do {
    std::__cxx11::string::~string((string *)((long)&local_c0._M_dataplus._M_p + lVar1));
    lVar1 = lVar1 + -0x20;
  } while (lVar1 != -0x20);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::__cxx11::string::~string((string *)&local_200);
  std::__cxx11::string::~string((string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  std::__cxx11::string::~string((string *)&local_160);
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)&local_120);
  std::__cxx11::string::~string((string *)&local_140);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_e0);
  return __return_storage_ptr__;
}

Assistant:

auto errors(const TArgs&... args) {
  return std::vector<std::string>{(".*" + std::string{args} + ".*")...};
}